

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetPropertyCommand.cxx
# Opt level: O0

bool __thiscall cmGetPropertyCommand::HandleDirectoryMode(cmGetPropertyCommand *this)

{
  undefined8 this_00;
  bool bVar1;
  PolicyStatus PVar2;
  ulong uVar3;
  string *psVar4;
  cmGlobalGenerator *this_01;
  char *pcVar5;
  PolicyID id;
  string local_b8;
  uint local_98;
  allocator<char> local_91;
  string local_90;
  string local_70;
  undefined1 local_40 [8];
  string dir;
  cmMakefile *mf;
  cmGetPropertyCommand *this_local;
  
  dir.field_2._8_8_ = (this->super_cmCommand).Makefile;
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::__cxx11::string::string((string *)local_40,(string *)&this->Name);
    bVar1 = cmsys::SystemTools::FileIsFullPath((string *)local_40);
    if (!bVar1) {
      psVar4 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
      std::__cxx11::string::operator=((string *)local_40,(string *)psVar4);
      std::__cxx11::string::operator+=((string *)local_40,"/");
      std::__cxx11::string::operator+=((string *)local_40,(string *)&this->Name);
    }
    cmsys::SystemTools::CollapseFullPath(&local_70,(string *)local_40);
    std::__cxx11::string::operator=((string *)local_40,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    this_01 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
    dir.field_2._8_8_ = cmGlobalGenerator::FindMakefile(this_01,(string *)local_40);
    bVar1 = (cmMakefile *)dir.field_2._8_8_ == (cmMakefile *)0x0;
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,
                 "DIRECTORY scope provided but requested directory was not found. This could be because the directory argument was invalid or, it is valid but has not been processed yet."
                 ,&local_91);
      cmCommand::SetError(&this->super_cmCommand,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::allocator<char>::~allocator(&local_91);
      this_local._7_1_ = 0;
    }
    local_98 = (uint)bVar1;
    std::__cxx11::string::~string((string *)local_40);
    if (local_98 != 0) goto LAB_0035e94c;
  }
  bVar1 = std::operator==(&this->PropertyName,"DEFINITIONS");
  if (bVar1) {
    PVar2 = cmMakefile::GetPolicyStatus((cmMakefile *)dir.field_2._8_8_,CMP0059,false);
    this_00 = dir.field_2._8_8_;
    if (PVar2 != OLD) {
      if (PVar2 != WARN) goto LAB_0035e924;
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_b8,(cmPolicies *)0x3b,id);
      cmMakefile::IssueMessage((cmMakefile *)this_00,AUTHOR_WARNING,&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
    }
    pcVar5 = cmMakefile::GetDefineFlagsCMP0059((cmMakefile *)dir.field_2._8_8_);
    this_local._7_1_ = StoreResult(this,pcVar5);
  }
  else {
LAB_0035e924:
    pcVar5 = cmMakefile::GetProperty((cmMakefile *)dir.field_2._8_8_,&this->PropertyName);
    this_local._7_1_ = StoreResult(this,pcVar5);
  }
LAB_0035e94c:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmGetPropertyCommand::HandleDirectoryMode()
{
  // Default to the current directory.
  cmMakefile* mf = this->Makefile;

  // Lookup the directory if given.
  if (!this->Name.empty()) {
    // Construct the directory name.  Interpret relative paths with
    // respect to the current directory.
    std::string dir = this->Name;
    if (!cmSystemTools::FileIsFullPath(dir)) {
      dir = this->Makefile->GetCurrentSourceDirectory();
      dir += "/";
      dir += this->Name;
    }

    // The local generators are associated with collapsed paths.
    dir = cmSystemTools::CollapseFullPath(dir);

    // Lookup the generator.
    mf = this->Makefile->GetGlobalGenerator()->FindMakefile(dir);
    if (!mf) {
      // Could not find the directory.
      this->SetError(
        "DIRECTORY scope provided but requested directory was not found. "
        "This could be because the directory argument was invalid or, "
        "it is valid but has not been processed yet.");
      return false;
    }
  }

  if (this->PropertyName == "DEFINITIONS") {
    switch (mf->GetPolicyStatus(cmPolicies::CMP0059)) {
      case cmPolicies::WARN:
        mf->IssueMessage(MessageType::AUTHOR_WARNING,
                         cmPolicies::GetPolicyWarning(cmPolicies::CMP0059));
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        return this->StoreResult(mf->GetDefineFlagsCMP0059());
      case cmPolicies::NEW:
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
        break;
    }
  }

  // Get the property.
  return this->StoreResult(mf->GetProperty(this->PropertyName));
}